

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtility.cpp
# Opt level: O0

string * __thiscall
llbuild::basic::shellEscaped_abi_cxx11_(string *__return_storage_ptr__,basic *this,StringRef string)

{
  size_t sVar1;
  StringRef string_00;
  StringRef local_90;
  basic *local_80;
  char *local_78;
  undefined1 local_70 [8];
  raw_svector_ostream os;
  SmallString<16U> out;
  StringRef string_local;
  
  sVar1 = string.Length;
  string_00.Data = string.Data;
  llvm::SmallString<16U>::SmallString((SmallString<16U> *)&os.OS);
  llvm::raw_svector_ostream::raw_svector_ostream
            ((raw_svector_ostream *)local_70,(SmallVectorImpl<char> *)&os.OS);
  string_00.Length = sVar1;
  local_80 = this;
  local_78 = string_00.Data;
  appendShellEscapedString((basic *)local_70,(raw_ostream *)this,string_00);
  local_90 = llvm::SmallString<16U>::str((SmallString<16U> *)&os.OS);
  llvm::StringRef::operator_cast_to_string(__return_storage_ptr__,&local_90);
  llvm::raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_70);
  llvm::SmallString<16U>::~SmallString((SmallString<16U> *)&os.OS);
  return __return_storage_ptr__;
}

Assistant:

std::string shellEscaped(StringRef string) {
  SmallString<16> out;
  llvm::raw_svector_ostream os(out);
  appendShellEscapedString(os, string);
  return out.str();
}